

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O2

WasmSplitOptions * __thiscall
wasm::WasmSplitOptions::add
          (WasmSplitOptions *this,string *longName,string *shortName,string *description,
          string *category,
          vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *modes
          ,Arguments arguments,Action *action)

{
  pointer pMVar1;
  ostream *o;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  pointer pMVar2;
  stringstream local_268 [8];
  stringstream desc;
  ostream local_258 [376];
  undefined1 local_e0 [8];
  string sep;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  Mode local_78 [2];
  Mode m;
  string *local_58;
  string *local_50;
  string *local_48;
  WasmSplitOptions *local_40;
  string *local_38;
  
  local_38 = longName;
  std::__cxx11::stringstream::stringstream(local_268);
  if ((modes->
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (modes->
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    std::operator<<(local_258,'[');
    local_58 = category;
    local_50 = shortName;
    local_48 = description;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e0,"",(allocator<char> *)local_78);
    pMVar1 = (modes->
             super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_40 = this;
    for (pMVar2 = (modes->
                  super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                  )._M_impl.super__Vector_impl_data._M_start; pMVar2 != pMVar1; pMVar2 = pMVar2 + 1)
    {
      local_78[0] = *pMVar2;
      std::__detail::
      _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)((this->validOptions)._M_elems + local_78[0]),local_38);
      o = std::operator<<(local_258,(string *)local_e0);
      anon_unknown_12::operator<<(o,local_78);
      std::__cxx11::string::assign((char *)local_e0);
    }
    std::operator<<(local_258,"] ");
    std::__cxx11::string::~string((string *)local_e0);
    category = local_58;
    shortName = local_50;
    description = local_48;
    this = local_40;
  }
  std::operator<<(local_258,(string *)description);
  std::__cxx11::stringbuf::str();
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_e0,action);
  std::__cxx11::string::string((string *)(sep.field_2._M_local_buf + 8),(string *)local_38);
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  this_00 = (function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)operator_new(0x48);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(this_00,(function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)local_e0);
  std::__cxx11::string::string((string *)(this_00 + 1),(string *)(sep.field_2._M_local_buf + 8));
  *(WasmSplitOptions **)&this_00[2].super__Function_base._M_functor = this;
  pcStack_80 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:367:5)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:367:5)>
             ::_M_manager;
  local_98._M_unused._M_object = this_00;
  wasm::Options::add((string *)this,(string *)local_38,(string *)shortName,(string *)local_78,
                     (Arguments)category,(function *)(ulong)arguments,SUB81(&local_98,0));
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  add(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<wasm::WasmSplitOptions::Mode,std::allocator<wasm::WasmSplitOptions::Mode>>&&,wasm::Options::Arguments,std::function<void(wasm::Options*,std::__cxx11::string_const&)>const&)
  ::$_0::~__0((__0 *)local_e0);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::stringstream::~stringstream(local_268);
  return this;
}

Assistant:

WasmSplitOptions& WasmSplitOptions::add(const std::string& longName,
                                        const std::string& shortName,
                                        const std::string& description,
                                        const std::string& category,
                                        std::vector<Mode>&& modes,
                                        Arguments arguments,
                                        const Action& action) {
  // Insert the valid modes at the beginning of the description.
  std::stringstream desc;
  if (modes.size()) {
    desc << '[';
    std::string sep = "";
    for (Mode m : modes) {
      validOptions[static_cast<unsigned>(m)].insert(longName);
      desc << sep << m;
      sep = ", ";
    }
    desc << "] ";
  }
  desc << description;
  ToolOptions::add(
    longName,
    shortName,
    desc.str(),
    category,
    arguments,
    [&, action, longName](Options* o, const std::string& argument) {
      usedOptions.push_back(longName);
      action(o, argument);
    });
  return *this;
}